

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int doWalCallbacks(sqlite3 *db)

{
  Btree *p;
  int iVar1;
  Pager *pPager;
  int nEntry;
  Btree *pBt;
  int i;
  int rc;
  sqlite3 *db_local;
  
  pBt._4_4_ = 0;
  for (pBt._0_4_ = 0; (int)pBt < db->nDb; pBt._0_4_ = (int)pBt + 1) {
    p = db->aDb[(int)pBt].pBt;
    if (p != (Btree *)0x0) {
      sqlite3BtreeEnter(p);
      pPager = sqlite3BtreePager(p);
      iVar1 = sqlite3PagerWalCallback(pPager);
      sqlite3BtreeLeave(p);
      if (((0 < iVar1) && (db->xWalCallback != (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0))
         && (pBt._4_4_ == 0)) {
        pBt._4_4_ = (*db->xWalCallback)(db->pWalArg,db,db->aDb[(int)pBt].zDbSName,iVar1);
      }
    }
  }
  return pBt._4_4_;
}

Assistant:

static int doWalCallbacks(sqlite3 *db){
  int rc = SQLITE_OK;
#ifndef SQLITE_OMIT_WAL
  int i;
  for(i=0; i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( pBt ){
      int nEntry;
      sqlite3BtreeEnter(pBt);
      nEntry = sqlite3PagerWalCallback(sqlite3BtreePager(pBt));
      sqlite3BtreeLeave(pBt);
      if( nEntry>0 && db->xWalCallback && rc==SQLITE_OK ){
        rc = db->xWalCallback(db->pWalArg, db, db->aDb[i].zDbSName, nEntry);
      }
    }
  }
#endif
  return rc;
}